

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.hh
# Opt level: O1

bool __thiscall
tchecker::
cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
::operator==(cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
             *this,cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>
                   *it)

{
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  
  if (this->_nranges == it->_nranges) {
    pcVar2 = (this->_begins).
             super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar1 = (this->_begins).
             super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pcVar3 = (it->_begins).
             super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pcVar1 - (long)pcVar2 ==
        (long)(it->_begins).
              super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3) {
      bVar4 = pcVar2 == pcVar1;
      if (!bVar4) {
        if ((pcVar2->super_const_iterator)._M_current != (pcVar3->super_const_iterator)._M_current)
        {
          return false;
        }
        while( true ) {
          pcVar3 = pcVar3 + 1;
          pcVar2 = pcVar2 + 1;
          bVar4 = pcVar2 == pcVar1;
          if (bVar4) break;
          if ((pcVar2->super_const_iterator)._M_current != (pcVar3->super_const_iterator)._M_current
             ) {
            return false;
          }
        }
      }
      if (bVar4) {
        pcVar2 = (this->_ends).
                 super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pcVar1 = (this->_ends).
                 super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar3 = (it->_ends).
                 super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pcVar1 - (long)pcVar2 ==
            (long)(it->_ends).
                  super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3) {
          bVar4 = pcVar2 == pcVar1;
          if (!bVar4) {
            if ((pcVar2->super_const_iterator)._M_current !=
                (pcVar3->super_const_iterator)._M_current) {
              return false;
            }
            while( true ) {
              pcVar3 = pcVar3 + 1;
              pcVar2 = pcVar2 + 1;
              bVar4 = pcVar2 == pcVar1;
              if (bVar4) break;
              if ((pcVar2->super_const_iterator)._M_current !=
                  (pcVar3->super_const_iterator)._M_current) {
                return false;
              }
            }
          }
          if (bVar4) {
            pcVar2 = (this->_its).
                     super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pcVar1 = (this->_its).
                     super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pcVar3 = (it->_its).
                     super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((long)pcVar1 - (long)pcVar2 ==
                (long)(it->_its).
                      super__Vector_base<tchecker::system::locs_t::const_iterator_t,_std::allocator<tchecker::system::locs_t::const_iterator_t>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar3) {
              bVar4 = pcVar2 == pcVar1;
              if (!bVar4) {
                if ((pcVar2->super_const_iterator)._M_current !=
                    (pcVar3->super_const_iterator)._M_current) {
                  return false;
                }
                do {
                  pcVar3 = pcVar3 + 1;
                  pcVar2 = pcVar2 + 1;
                  if (pcVar2 == pcVar1) {
                    return pcVar2 == pcVar1;
                  }
                  bVar4 = false;
                } while ((pcVar2->super_const_iterator)._M_current ==
                         (pcVar3->super_const_iterator)._M_current);
              }
              return bVar4;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator==(tchecker::cartesian_iterator_t<R> const & it) const
  {
    return ((_nranges == it._nranges) && (_begins == it._begins) && (_ends == it._ends) && (_its == it._its));
  }